

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::CaptureSpecialInterleaved::check(CaptureSpecialInterleaved *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  float *pfVar4;
  bool bVar5;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x40))(0x8c8e,this->m_bo_id[0]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1467);
  pfVar4 = (float *)(**(code **)(lVar3 + 0xd00))(0x8c8e,0,0x30,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glMapBufferRange call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x146b);
  if ((*pfVar4 != 1.0) || (NAN(*pfVar4))) {
LAB_00935d7d:
    bVar5 = false;
  }
  else {
    if ((pfVar4[1] != 2.0) || (NAN(pfVar4[1]))) goto LAB_00935d7d;
    if ((pfVar4[2] != 3.0) || (NAN(pfVar4[2]))) goto LAB_00935d7d;
    if ((pfVar4[3] != 4.0) || (NAN(pfVar4[3]))) goto LAB_00935d7d;
    if ((pfVar4[8] != 5.0) || (NAN(pfVar4[8]))) goto LAB_00935d7d;
    if ((pfVar4[9] != 6.0) || (NAN(pfVar4[9]))) goto LAB_00935d7d;
    if ((pfVar4[10] != 7.0) || (NAN(pfVar4[10]))) goto LAB_00935d7d;
    if ((pfVar4[0xb] != 8.0) || (NAN(pfVar4[0xb]))) goto LAB_00935d7d;
    bVar5 = true;
  }
  (**(code **)(lVar3 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1475);
  (**(code **)(lVar3 + 0x40))(0x8c8e,this->m_bo_id[1]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1478);
  pfVar4 = (float *)(**(code **)(lVar3 + 0xd00))(0x8c8e,0,0x30,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glMapBufferRange call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x147b);
  if ((*pfVar4 == 9.0) && (!NAN(*pfVar4))) {
    if ((pfVar4[1] == 10.0) && (!NAN(pfVar4[1]))) {
      if ((pfVar4[2] == 11.0) && (!NAN(pfVar4[2]))) {
        if ((pfVar4[3] == 12.0) && (!NAN(pfVar4[3]))) {
          if ((pfVar4[8] == 13.0) && (!NAN(pfVar4[8]))) {
            if ((pfVar4[9] == 14.0) && (!NAN(pfVar4[9]))) {
              if ((pfVar4[10] == 15.0) && (!NAN(pfVar4[10]))) {
                if ((pfVar4[0xb] == 16.0) && (!NAN(pfVar4[0xb]))) goto LAB_00935e93;
              }
            }
          }
        }
      }
    }
  }
  bVar5 = false;
LAB_00935e93:
  (**(code **)(lVar3 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1485);
  return bVar5;
}

Assistant:

bool gl3cts::TransformFeedback::CaptureSpecialInterleaved::check()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool is_ok = true;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLfloat* results =
		(glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, s_bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange call failed.");

	if ((results[0] != 1.0) || (results[1] != 2.0) || (results[2] != 3.0) || (results[3] != 4.0) ||
		/* gl_SkipComponents4 here */
		(results[8] != 5.0) || (results[9] != 6.0) || (results[10] != 7.0) || (results[11] != 8.0))
	{
		is_ok = false;
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id[1]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	results = (glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, s_bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange call failed.");

	if ((results[0] != 9.0) || (results[1] != 10.0) || (results[2] != 11.0) || (results[3] != 12.0) ||
		/* gl_SkipComponents4 here */
		(results[8] != 13.0) || (results[9] != 14.0) || (results[10] != 15.0) || (results[11] != 16.0))
	{
		is_ok = false;
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}